

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleHashTable.h
# Opt level: O1

EntryType * __thiscall
SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
::FindEntry(SimpleHashTable<Js::JavascriptPromise_*,_int,_Memory::HeapAllocator,_DefaultComparer,_false,_PowerOf2Policy>
            *this,JavascriptPromise *key)

{
  uint uVar1;
  EntryType *pEVar2;
  
  uVar1 = HashKeyToBucket(this,key,this->size);
  for (pEVar2 = this->table[uVar1]; (pEVar2 != (EntryType *)0x0 && (pEVar2->key != key));
      pEVar2 = pEVar2->next) {
  }
  return pEVar2;
}

Assistant:

EntryType * FindEntry(TKey key)
    {
        uint targetBucket = HashKeyToBucket(key);
        return FindEntry(key, targetBucket);
    }